

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transitions.hpp
# Opt level: O3

event_process_result __thiscall
afsm::transitions::
state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,afsm::test::json_parser_def::context,unsigned_long>
::
transit_state_impl<afsm::inner_state_machine<afsm::test::json_parser_def::context::object,afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>,afsm::state<afsm::test::json_parser_def::context::end,afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>,afsm::test::events::end_object,afsm::actions::detail::guard_check<afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,afsm::test::json_parser_def::context::object,afsm::test::events::end_object,afsm::test::json_parser_def::context::can_close_object>,afsm::actions::detail::action_invocation<afsm::none,afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser___:state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>>>
          (state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,afsm::test::json_parser_def::context,unsigned_long>
           *this,end_object *event,long *source,undefined8 param_4,undefined8 param_5)

{
  long lVar1;
  long lVar2;
  
  lVar1 = *(long *)this;
  if (*source == 0) {
    lVar2 = *(long *)(lVar1 + 0x30);
    if (lVar2 == 2 && *(long *)(lVar1 + 0x10) == 2) goto LAB_003b0908;
  }
  else {
    lVar2 = *(long *)(lVar1 + 0x30);
  }
  if (*(long *)(lVar1 + 0x10) != 2) {
    return refuse;
  }
  if (lVar2 != 1) {
    return refuse;
  }
LAB_003b0908:
  state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context::object,afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>,afsm::test::json_parser_def::context::object,unsigned_long>
  ::exit<afsm::test::events::end_object_const&>
            ((state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context::object,afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>,afsm::test::json_parser_def::context::object,unsigned_long>
              *)(source + 1),event);
  orthogonal::
  regions_stack<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>
  ::pop<afsm::test::events::end_object>
            (*(regions_stack<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>
               **)(*(long *)this + 0x80),event);
  lVar1 = *(long *)this;
  *source = 0;
  source[2] = 2;
  lVar2 = source[1];
  source[5] = lVar2;
  source[4] = lVar2;
  source[3] = lVar2;
  source[6] = lVar1;
  *(undefined8 *)(this + 8) = param_5;
  return process;
}

Assistant:

actions::event_process_result
    transit_state_impl(Event&& event, SourceState& source, TargetState& target,
            Guard guard, Action action, SourceExit exit,
            TargetEnter enter, SourceClear clear,
            ::std::size_t target_index,
            def::tags::basic_exception_safety const&)
    {
        if (guard(*fsm_, source, event)) {
            auto const& observer = root_machine(*fsm_);
            exit(source, ::std::forward<Event>(event), *fsm_);
            observer.state_exited(*fsm_, source, event);
            action(::std::forward<Event>(event), *fsm_, source, target);
            enter(target, ::std::forward<Event>(event), *fsm_);
            observer.state_entered(*fsm_, target, event);
            if (clear(*fsm_, source))
                observer.state_cleared(*fsm_, source);
            current_state_ = target_index;
            observer.state_changed(*fsm_, source, target, event);
            return actions::event_process_result::process;
        }
        return actions::event_process_result::refuse;
    }